

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrueTypePrimitiveWriter.cpp
# Opt level: O2

EStatusCode __thiscall
TrueTypePrimitiveWriter::WriteBYTE(TrueTypePrimitiveWriter *this,Byte inValue)

{
  int iVar1;
  undefined4 extraout_var;
  Byte inValue_local;
  
  if (this->mInternalState != eFailure) {
    iVar1 = (*(this->mTrueTypeFile->super_IByteWriterWithPosition).super_IByteWriter.
              _vptr_IByteWriter[2])(this->mTrueTypeFile,&inValue_local,1);
    if (CONCAT44(extraout_var,iVar1) == 1) {
      return eSuccess;
    }
    this->mInternalState = eFailure;
  }
  return eFailure;
}

Assistant:

EStatusCode TrueTypePrimitiveWriter::WriteBYTE(Byte inValue)
{
	if(PDFHummus::eFailure == mInternalState)
		return PDFHummus::eFailure;

	EStatusCode status = (mTrueTypeFile->Write(&inValue,1) == 1 ? PDFHummus::eSuccess : PDFHummus::eFailure);

	if(PDFHummus::eFailure == status)
		mInternalState = PDFHummus::eFailure;
	return status;	
}